

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O0

SUNErrCode SUNDataNode_AddNamedChild_InMem(SUNDataNode self,char *name,SUNDataNode child_node)

{
  int64_t iVar1;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_4;
  
  *(undefined8 *)(*(long *)(in_RDX + 0x10) + 0x18) = in_RSI;
  iVar1 = SUNHashMap_Insert((SUNHashMap)self,name,child_node);
  if (iVar1 == 0) {
    **(long **)(in_RDX + 0x10) = in_RDI;
    *(long *)(*(long *)(in_RDI + 0x10) + 0x28) = *(long *)(*(long *)(in_RDI + 0x10) + 0x28) + 1;
    local_4 = 0;
  }
  else {
    local_4 = -0x2706;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNDataNode_AddNamedChild_InMem(SUNDataNode self, const char* name,
                                           SUNDataNode child_node)
{
  SUNFunctionBegin(self->sunctx);

  SUNAssert(BASE_MEMBER(self, dtype) == SUNDATANODE_OBJECT,
            SUN_ERR_ARG_WRONGTYPE);

  IMPL_MEMBER(child_node, name) = name;
  if (SUNHashMap_Insert(IMPL_MEMBER(self, named_children), name, child_node))
  {
    return SUN_ERR_OP_FAIL;
  }

  IMPL_MEMBER(child_node, parent) = self;
  IMPL_MEMBER(self, num_named_children)++;

  return SUN_SUCCESS;
}